

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int file_walk_cb(char *fpath,stat *sb,int typeflag,FTW *ftwbuf)

{
  Hash *__dest;
  uint uVar1;
  PerfProfBatch *pPVar2;
  AppCtx *ctx;
  int iVar3;
  char *__s1;
  uint uVar4;
  byte bVar5;
  int32_t *piVar6;
  Instance instance;
  PerfProfInput input;
  Instance local_1200;
  Hash local_11b1;
  PerfProfInput local_1170;
  
  ctx = G_app_ctx_ptr;
  if ((typeflag & 0xfffffffbU) == 0) {
    __s1 = os_get_fext(fpath);
    if ((__s1 != (char *)0x0) && (iVar3 = strcmp(__s1,"vrp"), iVar3 == 0)) {
      parse(&local_1200,fpath);
      if ((local_1200.num_customers < 1) ||
         (((local_1200.num_vehicles < 1 || (local_1200.vehicle_cap <= 0.0)) ||
          (local_1200.demands == (double *)0x0)))) {
        log_log(0x80,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/main.c"
                ,0x1b3,"%s: Failed to parse input file\n",fpath);
        exit(1);
      }
      pPVar2 = ctx->current_batch;
      if (((local_1200.num_customers < (pPVar2->filter).ncustomers.a) ||
          ((pPVar2->filter).ncustomers.b < local_1200.num_customers)) ||
         ((local_1200.num_vehicles < (pPVar2->filter).nvehicles.a ||
          ((pPVar2->filter).nvehicles.b < local_1200.num_vehicles)))) {
        printf("%s: Skipping since it does not match filter\n",fpath);
      }
      else {
        memset(&local_1170,0,0x1148);
        strncpy(local_1170.filepath,fpath,0x1000);
        local_1170.filepath[0xfff] = '\0';
        strncpy(local_1170.instance_name,local_1200.name,0x100);
        local_1170.instance_name[0xff] = '\0';
        __dest = &local_1170.uid.hash;
        hash_instance(&local_11b1,&local_1200);
        memcpy(__dest,&local_11b1,0x41);
        printf("--- instance_hash :: computed_hash = %s\n",__dest);
        uVar1 = ctx->current_batch->nseeds;
        uVar4 = 100;
        if ((int)uVar1 < 100) {
          uVar4 = uVar1 & 0xff;
        }
        if (uVar4 != 0) {
          piVar6 = RANDOM_SEEDS;
          bVar5 = 0;
          do {
            if (ctx->should_terminate == true) break;
            local_1170.seed = *piVar6;
            local_1170.uid.seedidx = bVar5;
            handle_vrp_instance(ctx,&local_1170);
            bVar5 = bVar5 + 1;
            piVar6 = piVar6 + 1;
          } while (bVar5 < (byte)uVar4);
        }
      }
      instance_destroy(&local_1200);
    }
  }
  else if (typeflag == 1) {
    printf("Found dir: %s\n",fpath);
  }
  return (int)ctx->should_terminate;
}

Assistant:

int file_walk_cb(const char *fpath, const struct stat *sb, int typeflag,
                 struct FTW *ftwbuf) {
    UNUSED_PARAM(sb);
    UNUSED_PARAM(ftwbuf);

    AppCtx *ctx = G_app_ctx_ptr;

    if (typeflag == FTW_F || typeflag == FTW_SL) {
        // Is a regular file
        const char *ext = os_get_fext(fpath);
        if (ext && (0 == strcmp(ext, "vrp"))) {
            // printf("Found file: %s\n", fpath);

            Instance instance = parse(fpath);
            if (is_valid_instance(&instance)) {
                Filter *filter = &ctx->current_batch->filter;
                if (!is_filtered_instance(filter, &instance)) {

                    PerfProfInput input = {0};
                    strncpy_safe(input.filepath, fpath,
                                 ARRAY_LEN(input.filepath));

                    strncpy_safe(input.instance_name, instance.name,
                                 ARRAY_LEN(input.instance_name));

                    input.uid.hash = hash_instance(&instance);

                    printf("--- instance_hash :: computed_hash = %s\n",
                           input.uid.hash.cstr);

                    const uint8_t num_seeds = (uint8_t)(MIN(
                        UINT8_MAX, MIN(ctx->current_batch->nseeds,
                                       ARRAY_LEN_i32(RANDOM_SEEDS))));

                    for (uint8_t seedidx = 0;
                         seedidx < num_seeds && !ctx->should_terminate;
                         seedidx++) {
                        input.uid.seedidx = seedidx;

                        input.seed = RANDOM_SEEDS[seedidx];
                        handle_vrp_instance(ctx, &input);
                    }
                } else {
                    printf("%s: Skipping since it does not match filter\n",
                           fpath);
                }
                instance_destroy(&instance);
            } else {
                log_fatal("%s: Failed to parse input file\n", fpath);
                exit(EXIT_FAILURE);
            }
        }
    } else if (typeflag == FTW_D) {
        printf("Found dir: %s\n", fpath);
    }

    return ctx->should_terminate ? FTW_STOP : FTW_CONTINUE;
}